

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  idx_t local_78;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      local_78 = SelectGenericLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false,false,true>
                           (ldata,rdata,lsel,rsel,result_sel,count,lvalidity,rvalidity,
                            (SelectionVector *)0x0,false_sel);
    }
    else if (count == 0) {
      local_78 = 0;
    }
    else {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      local_78 = 0;
      uVar9 = 0;
      do {
        uVar11 = uVar9;
        if (psVar1 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar1[uVar9];
        }
        uVar7 = uVar9;
        if (psVar2 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar2[uVar9];
        }
        uVar8 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar9];
        }
        if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0))
           && ((puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))
              )) {
          if (((ldata[uVar7].months != rdata[uVar8].months) ||
              (ldata[uVar7].days != rdata[uVar8].days)) ||
             (ldata[uVar7].micros != rdata[uVar8].micros)) {
            lVar10 = (long)ldata[uVar7].days + ldata[uVar7].micros / 86400000000;
            lVar12 = (long)rdata[uVar8].days + rdata[uVar8].micros / 86400000000;
            if ((((long)ldata[uVar7].months + lVar10 / 0x1e !=
                  (long)rdata[uVar8].months + lVar12 / 0x1e) || (lVar10 % 0x1e != lVar12 % 0x1e)) ||
               (ldata[uVar7].micros % 86400000000 != rdata[uVar8].micros % 86400000000)) {
              true_sel->sel_vector[local_78] = (sel_t)uVar11;
              local_78 = local_78 + 1;
            }
          }
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
    return local_78;
  }
  iVar6 = SelectGenericLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false,true,true>
                    (ldata,rdata,lsel,rsel,result_sel,count,lvalidity,rvalidity,true_sel,false_sel);
  return iVar6;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}